

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  size_type sVar1;
  char *__file;
  bool bVar2;
  int iVar3;
  FilePath *path;
  undefined1 local_c8 [8];
  FilePath parent;
  FilePath local_38;
  
  sVar1 = (this->pathname_)._M_string_length;
  if ((sVar1 == 0) || (__file = (this->pathname_)._M_dataplus._M_p, __file[sVar1 - 1] != '/')) {
    bVar2 = false;
  }
  else {
    iVar3 = stat(__file,(stat *)local_c8);
    if ((iVar3 != 0) ||
       (bVar2 = true, (parent.pathname_.field_2._M_allocated_capacity._0_4_ & 0xf000) != 0x4000)) {
      RemoveTrailingPathSeparator(&local_38,this);
      RemoveFileName((FilePath *)local_c8,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38.pathname_._M_dataplus._M_p != &local_38.pathname_.field_2) {
        operator_delete(local_38.pathname_._M_dataplus._M_p,
                        local_38.pathname_.field_2._M_allocated_capacity + 1);
      }
      bVar2 = CreateDirectoriesRecursively((FilePath *)local_c8);
      if (bVar2) {
        bVar2 = CreateFolder(this);
      }
      else {
        bVar2 = false;
      }
      if (local_c8 != (undefined1  [8])&parent.pathname_._M_string_length) {
        operator_delete((void *)local_c8,parent.pathname_._M_string_length + 1);
      }
    }
  }
  return bVar2;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}